

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

void PaUtil_SetInterleavedOutputChannels
               (PaUtilBufferProcessor *bp,uint firstChannel,void *data,uint channelCount)

{
  uint uVar1;
  
  uVar1 = bp->outputChannelCount;
  if (channelCount == 0) {
    channelCount = uVar1;
  }
  if (uVar1 <= firstChannel) {
    __assert_fail("firstChannel < bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                  ,0x255,
                  "void PaUtil_SetInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (uVar1 < channelCount + firstChannel) {
    __assert_fail("firstChannel + channelCount <= bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                  ,0x256,
                  "void PaUtil_SetInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (bp->hostOutputIsInterleaved != 0) {
    uVar1 = 0;
    do {
      PaUtil_SetOutputChannel(bp,firstChannel + uVar1,data,channelCount);
      data = (void *)((long)data + (ulong)bp->bytesPerHostOutputSample);
      uVar1 = uVar1 + 1;
    } while (channelCount != uVar1);
    return;
  }
  __assert_fail("bp->hostOutputIsInterleaved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/common/pa_process.c"
                ,599,
                "void PaUtil_SetInterleavedOutputChannels(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_SetInterleavedOutputChannels( PaUtilBufferProcessor* bp,
        unsigned int firstChannel, void *data, unsigned int channelCount )
{
    unsigned int i;
    unsigned int channel = firstChannel;
    unsigned char *p = (unsigned char*)data;

    if( channelCount == 0 )
        channelCount = bp->outputChannelCount;

    assert( firstChannel < bp->outputChannelCount );
    assert( firstChannel + channelCount <= bp->outputChannelCount );
    assert( bp->hostOutputIsInterleaved );
    
    for( i=0; i< channelCount; ++i )
    {
        PaUtil_SetOutputChannel( bp, channel + i, p, channelCount );
        p += bp->bytesPerHostOutputSample;
    }
}